

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  undefined1 local_60 [8];
  Location loc;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_60 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  MakeUnique<wabt::MemoryModuleField,wabt::Location>
            ((wabt *)(loc.field_1.field2 + 8),(Location *)local_60);
  *(undefined2 *)(loc.field_1._8_8_ + 0x70) = *(undefined2 *)&page_limits->has_max;
  uVar2 = page_limits->max;
  *(uint64_t *)(loc.field_1._8_8_ + 0x60) = page_limits->initial;
  *(uint64_t *)(loc.field_1._8_8_ + 0x68) = uVar2;
  local_38._M_head_impl = (MemoryModuleField *)loc.field_1._8_8_;
  loc.field_1._8_8_ = 0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (MemoryModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (MemoryModuleField *)0x0;
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = MakeUnique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}